

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (serializer<toml::type_config> *this,table_type *t,table_format_info *fmt,
          comment_type *com,source_location *loc)

{
  bool bVar1;
  undefined8 uVar2;
  table_format_info *ptVar3;
  char *__s;
  char *in_RCX;
  undefined8 in_RDX;
  value_type *in_RSI;
  serializer<toml::type_config> *in_RDI;
  basic_value<toml::type_config> *e;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  array_type *__range10;
  basic_value<toml::type_config> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_1;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  table_type *__range8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> k;
  string_type *retval;
  undefined7 in_stack_fffffffffffff838;
  char in_stack_fffffffffffff83f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  value_type *in_stack_fffffffffffff848;
  source_location *in_stack_fffffffffffff850;
  source_location *loc_00;
  source_location *in_stack_fffffffffffff858;
  serialization_error *in_stack_fffffffffffff860;
  basic_value<toml::type_config> *in_stack_fffffffffffff868;
  allocator<char> *in_stack_fffffffffffff870;
  allocator<char> *__a;
  char *in_stack_fffffffffffff878;
  basic_value<toml::type_config> *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_stack_fffffffffffff8b0;
  indent_char indent_type;
  serializer<toml::type_config> *in_stack_fffffffffffff8b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8c0;
  serializer<toml::type_config> *in_stack_fffffffffffff8c8;
  serializer<toml::type_config> *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  table_type *in_stack_fffffffffffff910;
  serializer<toml::type_config> *in_stack_fffffffffffff918;
  table_format_info *in_stack_fffffffffffff968;
  table_type *in_stack_fffffffffffff970;
  serializer<toml::type_config> *in_stack_fffffffffffff978;
  table_format_info *in_stack_fffffffffffff9a8;
  table_type *in_stack_fffffffffffff9b0;
  serializer<toml::type_config> *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c8;
  source_location *in_stack_fffffffffffff9d0;
  string *in_stack_fffffffffffff9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f8;
  source_location *in_stack_fffffffffffffa00;
  table_format_info *in_stack_fffffffffffffa08;
  table_type *in_stack_fffffffffffffa10;
  serializer<toml::type_config> *in_stack_fffffffffffffa18;
  undefined1 local_5d1 [89];
  basic_value<toml::type_config> *local_578;
  undefined1 local_569;
  allocator<char> local_4e9 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_449 [2];
  undefined1 local_401;
  basic_value<toml::type_config> *local_2a0;
  reference local_298;
  reference local_290;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_288;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_280;
  undefined8 local_278;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_31;
  char *local_20;
  undefined8 local_18;
  serializer<toml::type_config> *this_01;
  
  indent_type = (indent_char)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
  if (((in_RSI->field_1).integer_.format.width & 1) == 0) {
    if (*in_RCX == '\0') {
      local_31 = 0;
      local_20 = in_RCX;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff850);
      format_keys(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x76f4f2);
      if (bVar1) {
        *(int *)((long)&in_RSI->field_1 + 0x14) =
             *(int *)((long)&in_RSI->field_1 + 0x14) + *(int *)(local_20 + 8);
        format_comments_abi_cxx11_
                  (in_stack_fffffffffffff8e8,(preserve_comments *)in_RSI,
                   (indent_char)((ulong)in_RDI >> 0x38));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        std::__cxx11::string::~string(in_stack_fffffffffffff840);
        format_indent_abi_cxx11_(in_stack_fffffffffffff8b8,indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        std::__cxx11::string::~string(in_stack_fffffffffffff840);
        *(int *)((long)&in_RSI->field_1 + 0x14) =
             *(int *)((long)&in_RSI->field_1 + 0x14) - *(int *)(local_20 + 8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,in_stack_fffffffffffff83f);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffff840);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        string_conv<std::__cxx11::string,3ul>
                  ((char (*) [3])CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        std::__cxx11::string::~string(in_stack_fffffffffffff840);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x76f6ee);
      format_ml_table(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8)
      ;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffff840,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
      std::__cxx11::string::~string(in_stack_fffffffffffff840);
    }
    else if (*in_RCX == '\x01') {
      format_inline_table(in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                          (table_format_info *)
                          CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    }
    else if (*in_RCX == '\x03') {
      format_ml_inline_table
                (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    }
    else if (*in_RCX == '\x02') {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x76f82f);
      bVar1 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff850);
      if (bVar1) {
        local_269 = 1;
        uVar2 = __cxa_allocate_exception(0xa0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        format_error<>(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8
                      );
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
        serialization_error::serialization_error
                  (in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858,
                   in_stack_fffffffffffff850);
        local_269 = 0;
        __cxa_throw(uVar2,&serialization_error::typeinfo,serialization_error::~serialization_error);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff840);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      local_26a = 0;
      format_dotted_table(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                          in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                          in_stack_fffffffffffff9f8);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x76facf);
      local_26a = 1;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff850);
    }
    else {
      local_26b = 0;
      local_18 = in_RDX;
      this_01 = in_RDI;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff850);
      local_278 = local_18;
      local_280._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
      local_288._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
      while (bVar1 = std::__detail::operator==(&local_280,&local_288), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_298 = std::__detail::
                    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                    ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                                 *)0x76fba6);
        local_2a0 = &local_298->second;
        local_290 = local_298;
        bVar1 = basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x76fbdf)
        ;
        if ((!bVar1) &&
           (bVar1 = basic_value<toml::type_config>::is_array_of_tables(in_stack_fffffffffffff868),
           !bVar1)) {
          local_401 = 1;
          uVar2 = __cxa_allocate_exception(0xa0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870);
          basic_value<toml::type_config>::location
                    ((basic_value<toml::type_config> *)
                     CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870);
          format_error<>(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                         in_stack_fffffffffffff9c8);
          basic_value<toml::type_config>::location
                    ((basic_value<toml::type_config> *)
                     CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
          serialization_error::serialization_error
                    (in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858,
                     in_stack_fffffffffffff850);
          local_401 = 0;
          __cxa_throw(uVar2,&serialization_error::typeinfo,serialization_error::~serialization_error
                     );
        }
        bVar1 = basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x76fe0e)
        ;
        if (bVar1) {
          ptVar3 = basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff880);
          if ((ptVar3->fmt != multiline) &&
             (ptVar3 = basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff880),
             ptVar3->fmt != implicit)) {
            local_569 = 1;
            __s = (char *)__cxa_allocate_exception(0xa0);
            this_00 = local_449;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,__s,in_stack_fffffffffffff870);
            basic_value<toml::type_config>::location
                      ((basic_value<toml::type_config> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
            __a = local_4e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
            format_error<>(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                           in_stack_fffffffffffff9c8);
            basic_value<toml::type_config>::location
                      ((basic_value<toml::type_config> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
            serialization_error::serialization_error
                      (in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858,
                       in_stack_fffffffffffff850);
            local_569 = 0;
            __cxa_throw(__s,&serialization_error::typeinfo,serialization_error::~serialization_error
                       );
          }
        }
        else {
          in_stack_fffffffffffff868 =
               (basic_value<toml::type_config> *)
               basic_value<toml::type_config>::as_array(in_stack_fffffffffffff880);
          local_578 = in_stack_fffffffffffff868;
          local_5d1._81_8_ =
               std::
               vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                        *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
          local_5d1._73_8_ =
               std::
               vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
          while (bVar1 = __gnu_cxx::
                         operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                   ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                     *)in_stack_fffffffffffff840,
                                    (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838)
                                   ), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_5d1._65_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                 ::operator*((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                              *)(local_5d1 + 0x51));
            in_stack_fffffffffffff860 =
                 (serialization_error *)
                 basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff880);
            if (((in_stack_fffffffffffff860->super_exception).super_exception != (exception)0x0) &&
               (in_stack_fffffffffffff858 =
                     (source_location *)
                     basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff880),
               in_stack_fffffffffffff858->is_ok_ != true)) {
              uVar2 = __cxa_allocate_exception(0xa0);
              loc_00 = (source_location *)local_5d1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                         in_stack_fffffffffffff870);
              basic_value<toml::type_config>::location
                        ((basic_value<toml::type_config> *)
                         CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                         in_stack_fffffffffffff870);
              format_error<>(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                             in_stack_fffffffffffff9c8);
              basic_value<toml::type_config>::location
                        ((basic_value<toml::type_config> *)
                         CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
              serialization_error::serialization_error
                        (in_stack_fffffffffffff860,(string *)in_stack_fffffffffffff858,loc_00);
              __cxa_throw(uVar2,&serialization_error::typeinfo,
                          serialization_error::~serialization_error);
            }
            __gnu_cxx::
            __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
            ::operator++((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                          *)(local_5d1 + 0x51));
          }
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        operator()[abi_cxx11_(this_01,in_RSI);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838));
        std::__cxx11::string::~string(in_stack_fffffffffffff840);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x7703cc);
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)in_stack_fffffffffffff840);
      }
    }
  }
  else if (*in_RCX == '\x03') {
    format_ml_inline_table
              (in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  }
  else {
    format_inline_table(in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                        (table_format_info *)
                        CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
  }
  return (string_type *)in_RDI;
}

Assistant:

string_type operator()(const table_type& t, const table_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        if(this->force_inline_)
        {
            if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else
            {
                return this->format_inline_table(t, fmt);
            }
        }
        else
        {
            if(fmt.fmt == table_format::multiline)
            {
                string_type retval;
                // comment is emitted inside format_ml_table
                if(auto k = this->format_keys(this->keys_))
                {
                    this->current_indent_ += fmt.name_indent;
                    retval += this->format_comments(com, fmt.indent_type);
                    retval += this->format_indent(fmt.indent_type);
                    this->current_indent_ -= fmt.name_indent;
                    retval += char_type('[');
                    retval += k.value();
                    retval += string_conv<string_type>("]\n");
                }
                // otherwise, its the root.

                retval += this->format_ml_table(t, fmt);
                return retval;
            }
            else if(fmt.fmt == table_format::oneline)
            {
                return this->format_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::dotted)
            {
                std::vector<string_type> keys;
                if(this->keys_.empty())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "dotted table must have its key. use format(key, v)",
                        loc, "here"), loc);
                }
                keys.push_back(this->keys_.back());

                const auto retval = this->format_dotted_table(t, fmt, loc, keys);
                keys.pop_back();
                return retval;
            }
            else
            {
                assert(fmt.fmt == table_format::implicit);

                string_type retval;
                for(const auto& kv : t)
                {
                    const auto& k = kv.first;
                    const auto& v = kv.second;

                    if( ! v.is_table() && ! v.is_array_of_tables())
                    {
                        throw serialization_error(format_error("toml::serializer: "
                            "an implicit table cannot have non-table value.",
                            v.location(), "here"), v.location());
                    }
                    if(v.is_table())
                    {
                        if(v.as_table_fmt().fmt != table_format::multiline &&
                           v.as_table_fmt().fmt != table_format::implicit)
                        {
                            throw serialization_error(format_error("toml::serializer: "
                                "an implicit table cannot have non-multiline table",
                                v.location(), "here"), v.location());
                        }
                    }
                    else
                    {
                        assert(v.is_array());
                        for(const auto& e : v.as_array())
                        {
                            if(e.as_table_fmt().fmt != table_format::multiline &&
                               v.as_table_fmt().fmt != table_format::implicit)
                            {
                                throw serialization_error(format_error("toml::serializer: "
                                    "an implicit table cannot have non-multiline table",
                                    e.location(), "here"), e.location());
                            }
                        }
                    }

                    keys_.push_back(k);
                    retval += (*this)(v);
                    keys_.pop_back();
                }
                return retval;
            }
        }
    }